

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>
     *this,int i)

{
  value_type_conflict1 *pvVar1;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  *in_RDI;
  value_type vVar2;
  int in_stack_ffffffffffffffdc;
  
  vVar2 = FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
          ::dx(in_RDI,in_stack_ffffffffffffffdc);
  pvVar1 = FadCst<double>::val((FadCst<double> *)&(in_RDI->fadexpr_).right_);
  return vVar2 / *pvVar1;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) / right_.val();}